

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall
vera::Image::Image(Image *this,uint8_t *_array3D,int _height,int _width,int _channels)

{
  undefined8 in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_003ec988;
  paVar2 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->m_path).field_2;
  (this->m_path)._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_path,"");
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*this->_vptr_Image[0x10])
            (this,_array3D,(ulong)(uint)_height,(ulong)(uint)_width,_channels,in_R9,&this->m_data,
             paVar1,paVar2);
  return;
}

Assistant:

Image::Image(const uint8_t* _array3D, int _height, int _width, int _channels): m_path("") {
    set(_array3D, _height, _width, _channels);
}